

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_cache.hpp
# Opt level: O0

bool __thiscall
cappuccino::
fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_insert_update(fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                   *this,unsigned_long *key,
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,allow a)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false>
  local_40;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false>
  local_38;
  iterator keyed_position;
  allow a_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  unsigned_long *key_local;
  fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  
  keyed_position.
  super__Node_iterator_base<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false>
             )(_Node_iterator_base<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false>
               )a;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>_>_>
       ::find(&this->m_keyed_elements,key);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>_>_>
       ::end(&this->m_keyed_elements);
  bVar1 = std::__detail::operator!=(&local_38,&local_40);
  if (bVar1) {
    bVar1 = update_allowed((allow)keyed_position.
                                  super__Node_iterator_base<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false>
                                  ._M_cur);
    if (bVar1) {
      do_update(this,(keyed_iterator)local_38._M_cur,value);
      return true;
    }
  }
  else {
    bVar1 = insert_allowed((allow)keyed_position.
                                  super__Node_iterator_base<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false>
                                  ._M_cur);
    if (bVar1) {
      do_insert(this,key,value);
      return true;
    }
  }
  return false;
}

Assistant:

auto do_insert_update(const key_type& key, value_type&& value, allow a) -> bool
    {
        auto keyed_position = m_keyed_elements.find(key);
        if (keyed_position != m_keyed_elements.end())
        {
            if (update_allowed(a))
            {
                do_update(keyed_position, std::move(value));
                return true;
            }
        }
        else
        {
            if (insert_allowed(a))
            {
                do_insert(key, std::move(value));
                return true;
            }
        }

        return false;
    }